

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg.cc
# Opt level: O0

string * re2c::incond(string *__return_storage_ptr__,string *cond)

{
  ulong uVar1;
  string *cond_local;
  string *s;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"in condition \'");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)cond);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\' ");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string incond (const std::string & cond)
{
	std::string s;
	if (!cond.empty ())
	{
		s += "in condition '";
		s += cond;
		s += "' ";
	}
	return s;
}